

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptParser.cpp
# Opt level: O1

Value __thiscall
MiniScript::Parser::ParseUnaryMinus(Parser *this,Lexer *tokens,bool asLval,bool statementStart)

{
  long *plVar1;
  int iVar2;
  ParseState *this_00;
  undefined4 uVar3;
  ListStorage<MiniScript::TACLine> *pLVar4;
  undefined7 in_register_00000011;
  Lexer *this_01;
  anon_union_8_3_2f476f46_for_data extraout_RDX;
  anon_union_8_3_2f476f46_for_data extraout_RDX_00;
  anon_union_8_3_2f476f46_for_data extraout_RDX_01;
  anon_union_8_3_2f476f46_for_data extraout_RDX_02;
  anon_union_8_3_2f476f46_for_data extraout_RDX_03;
  anon_union_8_3_2f476f46_for_data extraout_RDX_04;
  anon_union_8_3_2f476f46_for_data extraout_RDX_05;
  anon_union_8_3_2f476f46_for_data extraout_RDX_06;
  anon_union_8_3_2f476f46_for_data extraout_RDX_07;
  anon_union_8_3_2f476f46_for_data extraout_RDX_08;
  anon_union_8_3_2f476f46_for_data extraout_RDX_09;
  anon_union_8_3_2f476f46_for_data aVar5;
  anon_union_8_3_2f476f46_for_data extraout_RDX_10;
  Value VVar6;
  Value val;
  Value local_120;
  Value local_110;
  Value local_100;
  undefined1 local_f0 [8];
  StringStorage *local_e8;
  bool local_e0;
  Lexer local_d0;
  Lexer local_c8;
  Lexer local_c0;
  ListStorage<MiniScript::TACLine> *local_b8;
  TACLine local_b0;
  Token local_50;
  
  this_01 = (Lexer *)CONCAT71(in_register_00000011,asLval);
  local_b8 = (ListStorage<MiniScript::TACLine> *)tokens;
  Lexer::Peek((Token *)local_f0,this_01);
  uVar3 = local_f0._0_4_;
  if ((local_e8 != (StringStorage *)0x0) && (local_e0 == false)) {
    plVar1 = &(local_e8->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(local_e8->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
    local_e8 = (StringStorage *)0x0;
  }
  if (uVar3 == OpMinus) {
    Lexer::Dequeue(&local_50,this_01);
    if ((local_50.text.ss != (StringStorage *)0x0) && (local_50.text.isTemp == false)) {
      plVar1 = &((local_50.text.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_50.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_50.text.ss = (StringStorage *)0x0;
    }
    local_c8.ls = this_01->ls;
    if (local_c8.ls != (LexerStorage *)0x0) {
      (local_c8.ls)->refCount = (local_c8.ls)->refCount + 1;
    }
    AllowLineBreak(&local_c8);
    Lexer::release(&local_c8);
    pLVar4 = local_b8;
    local_d0.ls = this_01->ls;
    if (local_d0.ls != (LexerStorage *)0x0) {
      (local_d0.ls)->refCount = (local_d0.ls)->refCount + 1;
    }
    ParseNew((Parser *)local_f0,(Lexer *)local_b8,SUB81(&local_d0,0),false);
    Lexer::release(&local_d0);
    uVar3 = local_f0._0_4_;
    if (local_f0[0] == Number) {
      local_e8 = (StringStorage *)((ulong)local_e8 ^ 0x8000000000000000);
      *(undefined1 *)&(this->errorContext).ss = 1;
      *(undefined1 *)((long)&(this->errorContext).ss + 1) = local_f0[1];
      *(undefined1 *)((long)&(this->errorContext).ss + 2) = local_f0[2];
      *(StringStorage **)&(this->errorContext).isTemp = local_e8;
      aVar5 = extraout_RDX;
    }
    else {
      this_00 = (ParseState *)pLVar4[1].super_RefCountedStorage._vptr_RefCountedStorage;
      iVar2 = this_00->nextTempNum;
      this_00->nextTempNum = iVar2 + 1;
      local_100.type = Temp;
      local_100.noInvoke = false;
      local_100.localOnly = Off;
      local_100.data.tempNum = iVar2;
      local_110.type = Value::zero;
      local_110.noInvoke = DAT_001d32e1;
      local_110.localOnly = DAT_001d32e2;
      local_110.data.ref = DAT_001d32e8;
      if ((Temp < Value::zero) && (DAT_001d32e8 != (RefCountedStorage *)0x0)) {
        DAT_001d32e8->refCount = DAT_001d32e8->refCount + 1;
      }
      local_120.type = local_f0[0];
      local_120.noInvoke = (bool)local_f0[1];
      local_120.localOnly = local_f0[2];
      local_120.data.ref = &local_e8->super_RefCountedStorage;
      if ((Temp < local_f0[0]) && (local_e8 != (StringStorage *)0x0)) {
        plVar1 = &(local_e8->super_RefCountedStorage).refCount;
        *plVar1 = *plVar1 + 1;
      }
      local_f0._0_4_ = uVar3;
      TACLine::TACLine(&local_b0,&local_100,AMinusB,&local_110,&local_120);
      ParseState::Add(this_00,&local_b0);
      aVar5 = extraout_RDX_01;
      if ((local_b0.location.context.ss != (StringStorage *)0x0) &&
         (local_b0.location.context.isTemp == false)) {
        plVar1 = &((local_b0.location.context.ss)->super_RefCountedStorage).refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((local_b0.location.context.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          aVar5 = extraout_RDX_02;
        }
        local_b0.location.context.ss = (StringStorage *)0x0;
      }
      if ((local_b0.comment.ss != (StringStorage *)0x0) && (local_b0.comment.isTemp == false)) {
        plVar1 = &((local_b0.comment.ss)->super_RefCountedStorage).refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((local_b0.comment.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          aVar5 = extraout_RDX_03;
        }
        local_b0.comment.ss = (StringStorage *)0x0;
      }
      if ((Temp < local_b0.rhsB.type) &&
         ((StringStorage *)local_b0.rhsB.data.ref != (StringStorage *)0x0)) {
        plVar1 = &(local_b0.rhsB.data.ref)->refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((RefCountedStorage *)&(local_b0.rhsB.data.ref)->_vptr_RefCountedStorage)->
            _vptr_RefCountedStorage[1])();
          aVar5 = extraout_RDX_04;
        }
        local_b0.rhsB.data.number = 0.0;
      }
      if ((Temp < local_b0.rhsA.type) && (local_b0.rhsA.data.ref != (RefCountedStorage *)0x0)) {
        plVar1 = &(local_b0.rhsA.data.ref)->refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*(local_b0.rhsA.data.ref)->_vptr_RefCountedStorage[1])();
          aVar5 = extraout_RDX_05;
        }
        local_b0.rhsA.data.number = 0.0;
      }
      if ((2 < local_b0.lhs.type) &&
         ((ListStorage<MiniScript::BackPatch> *)local_b0.lhs.data.ref !=
          (ListStorage<MiniScript::BackPatch> *)0x0)) {
        plVar1 = &(local_b0.lhs.data.ref)->refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((RefCountedStorage *)&(local_b0.lhs.data.ref)->_vptr_RefCountedStorage)->
            _vptr_RefCountedStorage[1])();
          aVar5 = extraout_RDX_06;
        }
        local_b0.lhs.data.number = 0.0;
      }
      if ((Temp < local_120.type) && ((StringStorage *)local_120.data.ref != (StringStorage *)0x0))
      {
        plVar1 = &(local_120.data.ref)->refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((RefCountedStorage *)&(local_120.data.ref)->_vptr_RefCountedStorage)->
            _vptr_RefCountedStorage[1])();
          aVar5 = extraout_RDX_07;
        }
        local_120.data.number = 0.0;
      }
      if ((Temp < local_110.type) && (local_110.data.ref != (RefCountedStorage *)0x0)) {
        plVar1 = &(local_110.data.ref)->refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*(local_110.data.ref)->_vptr_RefCountedStorage[1])();
          aVar5 = extraout_RDX_08;
        }
        local_110.data.number = 0.0;
      }
      if ((Temp < local_100.type) && (local_100.data.ref != (RefCountedStorage *)0x0)) {
        plVar1 = &(local_100.data.ref)->refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*(local_100.data.ref)->_vptr_RefCountedStorage[1])();
          aVar5 = extraout_RDX_09;
        }
        local_100.data.number = 0.0;
      }
      *(undefined2 *)&(this->errorContext).ss = 2;
      *(undefined1 *)((long)&(this->errorContext).ss + 2) = 0;
      *(int *)&(this->errorContext).isTemp = iVar2;
    }
    if ((Number < local_f0[0]) && (local_e8 != (StringStorage *)0x0)) {
      plVar1 = &(local_e8->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_e8->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        aVar5 = extraout_RDX_10;
      }
    }
  }
  else {
    local_c0.ls = this_01->ls;
    if ((ParseState *)local_c0.ls != (ParseState *)0x0) {
      (((ParseState *)local_c0.ls)->code).ls =
           (ListStorage<MiniScript::TACLine> *)
           ((long)&(((((ParseState *)local_c0.ls)->code).ls)->super_RefCountedStorage).
                   _vptr_RefCountedStorage + 1);
    }
    ParseNew(this,(Lexer *)local_b8,SUB81(&local_c0,0),statementStart);
    Lexer::release(&local_c0);
    aVar5 = extraout_RDX_00;
  }
  VVar6.data.number = aVar5.number;
  VVar6._0_8_ = this;
  return VVar6;
}

Assistant:

Value Parser::ParseUnaryMinus(Lexer tokens, bool asLval, bool statementStart) {
		Value (Parser::*nextLevel)(Lexer tokens, bool asLval, bool statementStart) = &Parser::ParseNew;
		if (tokens.Peek().type != Token::Type::OpMinus) return (*this.*nextLevel)(tokens, asLval, statementStart);
		tokens.Dequeue();		// skip '-'

		AllowLineBreak(tokens); // allow a line break after a unary operator
		
		Value val = (*this.*nextLevel)(tokens, false, false);
		if (val.type == ValueType::Number) {
			// If what follows is a numeric literal, just invert it and be done!
			val.data.number = -val.data.number;
			return val;
		}
		// Otherwise, subtract it from 0 and return a new temporary.
		int tempNum = output->nextTempNum++;
		output->Add(TACLine(Value::Temp(tempNum), TACLine::Op::AMinusB, Value::zero, val));
		return Value::Temp(tempNum);
	}